

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanobenchmark.cc
# Opt level: O0

void __thiscall
highwayhash::DurationsForInputs::AddSample(DurationsForInputs *this,FuncInput input,float sample)

{
  Item *pIVar1;
  Item *item;
  size_t i;
  float sample_local;
  FuncInput input_local;
  DurationsForInputs *this_local;
  
  item = (Item *)0x0;
  while( true ) {
    if ((Item *)this->num_items <= item) {
      return;
    }
    pIVar1 = this->items + (long)item;
    if (pIVar1->input == input) break;
    item = (Item *)((long)&item->input + 1);
  }
  pIVar1->durations[pIVar1->num_durations] = sample;
  pIVar1->num_durations = pIVar1->num_durations + 1;
  return;
}

Assistant:

void DurationsForInputs::AddSample(const FuncInput input, const float sample) {
  for (size_t i = 0; i < num_items; ++i) {
    Item& item = items[i];
    if (item.input == input) {
      item.durations[item.num_durations] = sample;
      ++item.num_durations;
      return;
    }
  }
  NANOBENCHMARK_CHECK(!"Item not found");
}